

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reverse.h
# Opt level: O3

void Eigen::internal::vectorwise_reverse_inplace_impl<0>::run<Eigen::Matrix<double,_1,_1,0,_1,_1>>
               (Matrix<double,__1,__1,_0,__1,__1> *xpr)

{
  double *local_70;
  ulong local_68;
  ulong local_60;
  Matrix<double,__1,__1,_0,__1,__1> *local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  long local_40;
  double *local_38;
  ulong local_30;
  ulong local_28;
  Matrix<double,__1,__1,_0,__1,__1> *local_20;
  ulong local_18;
  undefined8 local_10;
  long local_8;
  
  local_40 = (xpr->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_rows;
  local_68 = local_40 / 2;
  local_70 = (xpr->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_data;
  local_60 = (xpr->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_cols;
  if ((long)(local_60 | local_68) < 0 && local_70 != (double *)0x0) {
    __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/MapBase.h"
                  ,0xb0,
                  "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>>, Level = 0]"
                 );
  }
  local_50 = 0;
  uStack_48 = 0;
  local_58 = xpr;
  if ((((-2 < local_40) && (local_40 != -1)) && (-1 < (long)local_60)) &&
     (local_18 = local_40 - local_68, -1 < (long)(local_60 | local_68 | local_18))) {
    local_38 = local_70 + local_18;
    local_10 = 0;
    local_30 = local_68;
    local_28 = local_60;
    local_20 = xpr;
    local_8 = local_40;
    DenseBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>>::
    swap<Eigen::Reverse<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,0>>
              ((DenseBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>> *)&local_70
               ,(DenseBase<Eigen::Reverse<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>_>
                 *)&local_38);
    return;
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/Block.h"
                ,0x93,
                "Eigen::Block<Eigen::Matrix<double, -1, -1>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
               );
}

Assistant:

static void run(ExpressionType &xpr)
  {
    Index half = xpr.rows()/2;
    xpr.topRows(half).swap(xpr.bottomRows(half).colwise().reverse());
  }